

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O3

int pty_exitcode(Backend *be)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*(char *)((long)&be[-4].vt + 5) == '\x01') {
    uVar1 = *(uint *)&be[-4].interactor & 0x7f;
    if (0x1ffffff < (int)(uVar1 * 0x1000000 + 0x1000000)) {
      return uVar1 | 0x80;
    }
    uVar1 = *(uint *)&be[-4].interactor >> 8 & 0xff;
  }
  return uVar1;
}

Assistant:

static int pty_exitcode(Backend *be)
{
    Pty *pty = container_of(be, Pty, backend);
    if (!pty->finished)
        return -1;                     /* not dead yet */
    else if (WIFSIGNALED(pty->exit_code))
        return 128 + WTERMSIG(pty->exit_code);
    else
        return WEXITSTATUS(pty->exit_code);
}